

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

long __thiscall
divsufsortxx::core::sort_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
          (core *this,char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long SAsize,
          int alphabetsize)

{
  core *pcVar1;
  pos_type pVar2;
  pos_type pVar3;
  iterator last;
  iterator last_00;
  iterator buf;
  bool bVar4;
  long lVar5;
  pos_type pVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  void *__s;
  long lVar11;
  BitmapArray<long> *pBVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long *plVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long *plVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long *plVar26;
  long lVar27;
  iterator first;
  iterator first_00;
  iterator PA;
  iterator PA_00;
  iterator first_01;
  iterator first_02;
  iterator ISA;
  iterator ISA_00;
  iterator last_01;
  iterator last_02;
  long *local_d0;
  
  __s = (void *)SA.pos_;
  pBVar12 = SA.array_;
  lVar24 = (long)(int)SAsize;
  if (0 < lVar24) {
    memset(__s,0,lVar24 * 8);
  }
  if ((int)SAsize != 0) {
    memset(bucket_A,0,
           (ulong)((int)SAsize * (int)SAsize + (uint)((int)SAsize * (int)SAsize == 0)) << 3);
  }
  lVar16 = (long)bucket_B + -1;
  lVar20 = lVar16;
  uVar15 = n;
  lVar13 = lVar16;
  if (0 < (long)bucket_B) {
LAB_00104cdf:
    do {
      lVar13 = lVar13 + -1;
      plVar26 = (long *)((long)__s + (long)(char)this[lVar20] * 8);
      *plVar26 = *plVar26 + 1;
      lVar27 = -1;
      if (0 < lVar20) {
        lVar5 = lVar20 + -1;
        lVar11 = lVar20 + -1;
        pcVar1 = this + lVar20;
        lVar20 = lVar5;
        if ((char)*pcVar1 <= (char)this[lVar11]) goto LAB_00104cdf;
        bucket_A[(char)this[lVar11] * (int)SAsize + (int)(char)*pcVar1] =
             bucket_A[(char)this[lVar11] * (int)SAsize + (int)(char)*pcVar1] + 1;
        lVar20 = uVar15 - 1;
        uVar15 = uVar15 - 1;
        (**(code **)(*(long *)T + 0x20))(T,(long)pBVar12 + lVar20,lVar5);
        if (lVar5 != 0) {
          do {
            if ((char)this[lVar13] < (char)this[lVar13 + -1]) {
              lVar27 = lVar13 + -1;
              break;
            }
            bucket_A[(char)this[lVar13] * (int)SAsize + (int)(char)this[lVar13 + -1]] =
                 bucket_A[(char)this[lVar13] * (int)SAsize + (int)(char)this[lVar13 + -1]] + 1;
            lVar13 = lVar13 + -1;
          } while (0 < lVar13);
        }
      }
      lVar20 = lVar27;
      lVar13 = lVar27;
    } while (-1 < lVar27);
  }
  lVar13 = n - uVar15;
  uVar22 = SAsize & 0xffffffff;
  if (0 < (int)SAsize) {
    plVar26 = bucket_A + 1;
    plVar17 = bucket_A + uVar22;
    lVar20 = -1;
    uVar19 = 0;
    lVar27 = 0;
    uVar18 = uVar22;
    do {
      uVar18 = uVar18 - 1;
      lVar5 = *(long *)((long)__s + uVar19 * 8);
      *(long *)((long)__s + uVar19 * 8) = lVar20 + lVar27;
      lVar20 = lVar5 + lVar20 + bucket_A[uVar19 + (uint)((int)uVar19 * (int)SAsize)];
      uVar19 = uVar19 + 1;
      if (uVar19 < uVar22) {
        uVar25 = 0;
        plVar21 = plVar17;
        do {
          lVar27 = lVar27 + plVar26[uVar25];
          plVar26[uVar25] = lVar27;
          lVar20 = lVar20 + *plVar21;
          uVar25 = uVar25 + 1;
          plVar21 = plVar21 + uVar22;
        } while (uVar18 != uVar25);
      }
      plVar26 = plVar26 + uVar22 + 1;
      plVar17 = plVar17 + uVar22 + 1;
    } while (uVar19 != uVar22);
  }
  if (0 < lVar13) {
    if (lVar13 != 1) {
      lVar20 = ~uVar15 + n;
      lVar27 = (long)pBVar12 + n + -2;
      do {
        lVar20 = lVar20 + -1;
        lVar5 = (**(code **)(*(long *)T + 0x28))(T,lVar27);
        lVar11 = (long)(char)this[lVar5] * (long)(int)SAsize + (long)(char)this[lVar5 + 1];
        lVar5 = bucket_A[lVar11];
        bucket_A[lVar11] = lVar5 + -1;
        (**(code **)(*(long *)T + 0x20))(T,(long)pBVar12 + lVar5 + -1,lVar20);
        lVar27 = lVar27 + -1;
      } while (0 < lVar20);
    }
    pVar6 = (long)pBVar12 + (n - lVar13);
    pVar2 = lVar13 + (long)pBVar12;
    lVar20 = lVar13 + -1;
    lVar27 = (**(code **)(*(long *)T + 0x28))(T,(long)pBVar12 + n + -1);
    lVar5 = (long)(char)this[lVar27] * (long)(int)SAsize + (long)(char)this[lVar27 + 1];
    lVar27 = bucket_A[lVar5];
    bucket_A[lVar5] = lVar27 + -1;
    (**(code **)(*(long *)T + 0x20))(T,(long)pBVar12 + lVar27 + -1,lVar20);
    lVar5 = n + lVar13 * -2;
    lVar27 = lVar20;
    if (lVar5 < 0x101) {
      local_d0 = (long *)operator_new__(0x800);
      lVar14 = (long)((int)SAsize + -1);
      plVar26 = (long *)((lVar24 * 8 + 8) * lVar14 + (long)bucket_A);
      lVar5 = lVar14;
      lVar11 = lVar13;
      plVar17 = plVar26;
      lVar23 = lVar14;
      do {
        for (; lVar23 < lVar5; lVar5 = lVar5 + -1) {
          lVar7 = *plVar26;
          if (1 < lVar11 - lVar7) {
            pVar3 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar7;
            lVar9 = (**(code **)(*(long *)T + 0x28))(T,pVar3);
            last_00.pos_ = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar11;
            last_00.array_ = (BitmapArray<long> *)T;
            PA_00.pos_ = pVar6;
            PA_00.array_ = (BitmapArray<long> *)T;
            first_02.pos_ = pVar3;
            first_02.array_ = (BitmapArray<long> *)T;
            substring::sort<char*,bitmap::BitmapArray<long>::iterator,long*>
                      ((char *)this,PA_00,first_02,last_00,local_d0,0x100,2,(value_type)bucket_B,
                       lVar9 == lVar20,0x400);
          }
          plVar26 = plVar26 + -1;
          lVar11 = lVar7;
        }
        lVar23 = lVar23 + -1;
        plVar26 = plVar17 + -lVar24;
        lVar5 = lVar14;
        plVar17 = plVar26;
      } while (0 < lVar11);
      bVar4 = true;
      while( true ) {
        if (local_d0 != (long *)0x0) {
          operator_delete__(local_d0);
        }
        if (bVar4) break;
        uVar10 = __cxa_rethrow();
        local_d0 = (long *)0x0;
        __cxa_begin_catch(uVar10);
        __cxa_end_catch();
        bVar4 = false;
      }
    }
    else {
      lVar7 = (long)((int)SAsize + -1);
      plVar26 = (long *)((lVar24 * 8 + 8) * lVar7 + (long)bucket_A);
      lVar11 = lVar7;
      lVar23 = lVar13;
      plVar17 = plVar26;
      lVar14 = lVar7;
      do {
        for (; lVar14 < lVar11; lVar11 = lVar11 + -1) {
          lVar9 = *plVar26;
          if (1 < lVar23 - lVar9) {
            pVar3 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar9;
            lVar8 = (**(code **)(*(long *)T + 0x28))(T,pVar3);
            last.pos_ = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar23;
            last.array_ = (BitmapArray<long> *)T;
            buf.pos_ = pVar2;
            buf.array_ = (BitmapArray<long> *)T;
            PA.pos_ = pVar6;
            PA.array_ = (BitmapArray<long> *)T;
            first_01.pos_ = pVar3;
            first_01.array_ = (BitmapArray<long> *)T;
            substring::
            sort<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                      ((char *)this,PA,first_01,last,buf,lVar5,2,(value_type)bucket_B,
                       lVar8 == lVar20,0x400);
          }
          plVar26 = plVar26 + -1;
          lVar23 = lVar9;
        }
        lVar14 = lVar14 + -1;
        plVar26 = plVar17 + -lVar24;
        lVar11 = lVar7;
        plVar17 = plVar26;
      } while (0 < lVar23);
    }
    do {
      lVar5 = (**(code **)(*(long *)T + 0x28))
                        (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar27);
      if (-1 < lVar5) {
        lVar5 = -1;
        do {
          lVar14 = lVar27;
          lVar23 = lVar5;
          lVar11 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar14;
          lVar27 = (**(code **)(*(long *)T + 0x28))(T,lVar11);
          (**(code **)(*(long *)T + 0x20))(T,lVar27 + pVar2,lVar14);
          if (lVar14 < 1) break;
          lVar7 = (**(code **)(*(long *)T + 0x28))(T,(long)pBVar12 + lVar14 + -1);
          lVar5 = lVar23 + -1;
          lVar27 = lVar14 + -1;
        } while (-1 < lVar7);
        (**(code **)(*(long *)T + 0x20))(T,lVar11,lVar23);
        if (lVar14 < 2) break;
        lVar27 = lVar14 + -1;
      }
      lVar5 = lVar27 + -1;
      do {
        lVar23 = lVar5;
        lVar5 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar23 + 1;
        uVar15 = (**(code **)(*(long *)T + 0x28))(T,lVar5);
        (**(code **)(*(long *)T + 0x20))(T,lVar5,~uVar15);
        lVar5 = (**(code **)(*(long *)T + 0x28))(T,lVar5);
        (**(code **)(*(long *)T + 0x20))(T,lVar5 + pVar2,lVar27);
        lVar11 = (**(code **)(*(long *)T + 0x28))
                           (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar23);
        lVar5 = lVar23 + -1;
      } while (lVar11 < 0);
      lVar5 = (**(code **)(*(long *)T + 0x28))
                        (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar23);
      (**(code **)(*(long *)T + 0x20))(T,lVar5 + pVar2,lVar27);
      lVar27 = lVar23 + -1;
    } while (1 < lVar23 + 1);
    first.pos_ = (pos_type)pBVar12;
    first.array_ = (BitmapArray<long> *)T;
    ISA.pos_ = pVar2;
    ISA.array_ = (BitmapArray<long> *)T;
    last_01.pos_ = pVar2;
    last_01.array_ = (BitmapArray<long> *)T;
    bVar4 = tandemrepeat::
            sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                      (ISA,first,last_01);
    if (!bVar4) {
      first_00.pos_ = (pos_type)pBVar12;
      first_00.array_ = (BitmapArray<long> *)T;
      ISA_00.pos_ = pVar2;
      ISA_00.array_ = (BitmapArray<long> *)T;
      last_02.pos_ = pVar2;
      last_02.array_ = (BitmapArray<long> *)T;
      doubling::sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (ISA_00,first_00,last_02);
    }
    lVar5 = lVar16;
    lVar27 = lVar16;
    lVar11 = lVar13;
    if (0 < (long)bucket_B) {
LAB_001053f0:
      do {
        lVar27 = lVar27 + -1;
        lVar23 = -1;
        if (0 < lVar5) {
          lVar14 = lVar5 + -1;
          lVar7 = lVar5 + -1;
          pcVar1 = this + lVar5;
          lVar5 = lVar14;
          if ((char)*pcVar1 <= (char)this[lVar7]) goto LAB_001053f0;
          lVar5 = lVar11 + pVar2;
          lVar11 = lVar11 + -1;
          lVar5 = (**(code **)(*(long *)T + 0x28))(T,lVar5 + -1);
          (**(code **)(*(long *)T + 0x20))
                    (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar5,lVar14);
          if (lVar14 != 0) {
            do {
              if ((char)this[lVar27] < (char)this[lVar27 + -1]) {
                lVar23 = lVar27 + -1;
                break;
              }
              lVar27 = lVar27 + -1;
            } while (0 < lVar27);
          }
        }
        lVar5 = lVar23;
        lVar27 = lVar23;
      } while (-1 < lVar23);
    }
    if (0 < (int)SAsize) {
      lVar27 = lVar24 + -1;
      do {
        if (lVar27 < (int)SAsize + -1) {
          lVar5 = lVar24 + -1;
          lVar11 = lVar16;
          do {
            lVar16 = lVar11 - bucket_A[lVar27 + lVar5 * uVar22];
            bucket_A[lVar27 + lVar5 * uVar22] = lVar11 + 1;
            lVar11 = bucket_A[lVar27 * uVar22 + lVar5];
            lVar23 = lVar20;
            if (lVar11 <= lVar20) {
              do {
                uVar10 = (**(code **)(*(long *)T + 0x28))
                                   (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar23);
                (**(code **)(*(long *)T + 0x20))
                          (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar16,uVar10);
                lVar16 = lVar16 + -1;
                lVar20 = lVar23 + -1;
                bVar4 = lVar11 < lVar23;
                lVar23 = lVar20;
              } while (bVar4);
            }
            lVar5 = lVar5 + -1;
            lVar11 = lVar16;
          } while (lVar27 < lVar5);
        }
        lVar11 = (long)((int)lVar27 * (int)SAsize);
        lVar5 = bucket_A[lVar27 + lVar11];
        bucket_A[lVar27 + lVar11] = lVar16 + 1;
        if (lVar27 < (int)SAsize + -1) {
          bucket_A[lVar27 + lVar27 * uVar22 + 1] = (lVar16 - lVar5) + 1;
        }
        lVar16 = *(long *)((long)__s + lVar27 * 8);
        bVar4 = 0 < lVar27;
        lVar27 = lVar27 + -1;
      } while (bVar4);
    }
  }
  return lVar13;
}

Assistant:

pos_type sort_typeBstar(const StringIterator_type T, SAIterator_type SA,
                        pos_type *bucket_A, pos_type *bucket_B, pos_type n,
                        pos_type SAsize, alphabetsize_type alphabetsize) {
  pos_type i, j, k, t, m, bufsize;
  alphabetsize_type c0, c1;

  /* Initialize bucket arrays. */
  for (i = 0; i < alphabetsize; ++i) {
    bucket_A[i] = 0;
  }
  for (i = 0; i < alphabetsize * alphabetsize; ++i) {
    bucket_B[i] = 0;
  }

  /* Count the number of occurrences of the first one or two characters of each
   type A, B and B* suffix. Moreover, store the beginning position of all
   type B* suffixes into the array SA. */
  for (i = n - 1, m = SAsize; 0 <= i;) {
    /* type A suffix. */
    do {
      ++BUCKET_A(T[i]);
    } while ((0 <= --i) && (T[i] >= T[i + 1]));
    if (0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(T[i], T[i + 1]);
      SA[--m] = i;
      /* type B suffix. */
      for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        ++BUCKET_B(T[i], T[i + 1]);
      }
    }
  }
  m = SAsize - m;

  /* Calculate the index of start/end point of each bucket. */
  for (c0 = 0, i = -1, j = 0; c0 < alphabetsize; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0)= i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for (c1 = c0 + 1; c1 < alphabetsize; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if (0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    SAIterator_type PAb = SA + SAsize - m, ISAb = SA + m;
    for (i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
    bufsize = SAsize - 2 * m;
    if (MERGE_BUFSIZE < bufsize) {
      SAIterator_type buf = SA + m;
      for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
        for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
          i = BUCKET_BSTAR(c0, c1);
          if (1 < (j - i)) {
            substring::sort(T, PAb, SA + i, SA + j, buf, bufsize, 2, n,
                            *(SA + i) == (m - 1));
          }
        }
      }
    } else {
      pos_type *lbuf = NULL;
      int err = 0;
      try {
        lbuf = new pos_type[MERGE_BUFSIZE];
        if (lbuf == NULL) {
          throw;
        }
        for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
          for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
            i = BUCKET_BSTAR(c0, c1);
            if (1 < (j - i)) {
              substring::sort(T, PAb, SA + i, SA + j, lbuf, MERGE_BUFSIZE, 2, n,
                              *(SA + i) == (m - 1));
            }
          }
        }
      } catch (...) {
        err = -1;
      }
      delete[] lbuf;
      if (err != 0) {
        throw;
      }
    }

    /* Compute ranks of type B* substrings. */
    for (i = m - 1; 0 <= i; --i) {
      if (0 <= SA[i]) {
        j = i;
        do {
          ISAb[SA[i]] = i;
        } while ((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if (i <= 0) {
          break;
        }
      }
      j = i;
      do {
        ISAb[SA[i] = ~SA[i]] = j;
      } while (SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using tandemrepeat/doubling sorting algorithms. */
    if (tandemrepeat::sort(ISAb, SA, SA + m) == false) {
      doubling::sort(ISAb, SA, SA + m);
    }

    /* Set the sorted order of tyoe B* suffixes. */
    for (i = n - 1, j = m; 0 <= i;) {
      for (--i; (0 <= i) && (T[i] >= T[i + 1]); --i) {
      }
      if (0 <= i) {
        SA[ISAb[--j]] = i;
        for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        }
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    for (c0 = alphabetsize - 1, i = n - 1, k = m - 1; 0 <= c0; --c0) {
      for (c1 = alphabetsize - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i + 1; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for (i = t, j = BUCKET_BSTAR(c0, c1); j <= k; --i, --k) {
          SA[i] = SA[k];
        }
      }
      t = i - BUCKET_B(c0, c0);
      BUCKET_B(c0, c0) = i + 1; /* end point */
      if (c0 < (alphabetsize - 1)) {
        BUCKET_BSTAR(c0, c0 + 1) = t + 1; /* start point */
      }
      i = BUCKET_A(c0);
    }
  }

  return m;
}